

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::type(Fl_File_Chooser *this,int t)

{
  int t_local;
  Fl_File_Chooser *this_local;
  
  this->type_ = t;
  if ((t & 1U) == 0) {
    Fl_Widget::type((Fl_Widget *)this->fileList,'\x02');
  }
  else {
    Fl_Widget::type((Fl_Widget *)this->fileList,'\x03');
  }
  if ((t & 2U) == 0) {
    Fl_Widget::deactivate(&this->newButton->super_Fl_Widget);
  }
  else {
    Fl_Widget::activate(&this->newButton->super_Fl_Widget);
  }
  if ((t & 4U) == 0) {
    Fl_File_Browser::filetype(this->fileList,0);
  }
  else {
    Fl_File_Browser::filetype(this->fileList,1);
  }
  return;
}

Assistant:

void Fl_File_Chooser::type(int t) {
  type_ = t;
  if (t & MULTI)
    fileList->type(FL_MULTI_BROWSER);
  else
    fileList->type(FL_HOLD_BROWSER);
  if (t & CREATE)
    newButton->activate();
  else
    newButton->deactivate();
  if (t & DIRECTORY)
    fileList->filetype(Fl_File_Browser::DIRECTORIES);
  else
    fileList->filetype(Fl_File_Browser::FILES);
}